

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O1

RayDifferential * __thiscall
pbrt::SurfaceInteraction::SpawnRay
          (RayDifferential *__return_storage_ptr__,SurfaceInteraction *this,RayDifferential *rayi,
          BSDF *bsdf,Vector3f wi,int flags,Float eta)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  undefined4 uVar18;
  undefined4 uVar19;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  Point3fi *pPVar30;
  Point3fi *pPVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  float fVar48;
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  float fVar49;
  float fVar54;
  float fVar55;
  float fVar56;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  Vector3f local_30;
  float local_24;
  
  local_30.super_Tuple3<pbrt::Vector3,_float>.z = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar47._8_56_ = wi._8_56_;
  auVar47._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  uVar11 = vmovlps_avx(auVar47._0_16_);
  local_30.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar11;
  local_30.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar11 >> 0x20);
  local_24 = eta;
  Interaction::SpawnRay(__return_storage_ptr__,&this->super_Interaction,&local_30);
  if (rayi->hasDifferentials == true) {
    uVar1 = (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x;
    uVar18 = (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar34._4_4_ = uVar18;
    auVar34._0_4_ = uVar1;
    auVar34._8_8_ = 0;
    uVar2 = (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y;
    uVar19 = (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar40._4_4_ = uVar19;
    auVar40._0_4_ = uVar2;
    auVar40._8_8_ = 0;
    uVar12._0_4_ = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar12._4_4_ = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar12;
    fVar67 = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
    fVar45 = (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.x;
    fVar48 = this->dudy;
    fVar56 = (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.x;
    fVar49 = this->dvdy;
    fVar55 = fVar49 * fVar56 + fVar45 * fVar48;
    fVar54 = (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x;
    uVar13._0_4_ = (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.y;
    uVar13._4_4_ = (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar13;
    uVar14._0_4_ = (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.y;
    uVar14._4_4_ = (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar14;
    uVar15._0_4_ = this->dudx;
    uVar15._4_4_ = this->dvdx;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar15;
    auVar32 = vpermi2ps_avx512vl(_DAT_02c8ab70,auVar42,ZEXT416((uint)fVar56));
    auVar33 = vshufps_avx(auVar36,auVar36,0xe1);
    auVar33 = vmulps_avx512vl(auVar33,auVar32);
    auVar32 = vpermi2ps_avx512vl(ZEXT416(4),auVar35,ZEXT416((uint)fVar45));
    auVar32 = vmulps_avx512vl(auVar36,auVar32);
    auVar57._0_4_ = auVar33._0_4_ + auVar32._0_4_;
    auVar57._4_4_ = auVar33._4_4_ + auVar32._4_4_;
    auVar57._8_4_ = auVar33._8_4_ + auVar32._8_4_;
    auVar57._12_4_ = auVar33._12_4_ + auVar32._12_4_;
    uVar16._0_4_ = (rayi->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar16._4_4_ = (rayi->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y;
    auVar33._0_8_ = uVar16 ^ 0x8000000080000000;
    auVar33._8_4_ = 0x80000000;
    auVar33._12_4_ = 0x80000000;
    auVar32 = vsubps_avx(auVar33,auVar34);
    auVar60._0_4_ = (float)(undefined4)uVar15 * (float)(undefined4)uVar14;
    auVar60._4_4_ = (float)uVar15._4_4_ * (float)uVar14._4_4_;
    auVar60._8_8_ = 0;
    auVar33 = vmovshdup_avx512vl(auVar42);
    auVar34 = vmulss_avx512f(auVar36,auVar33);
    auVar33 = vmovshdup_avx(auVar60);
    fVar45 = auVar34._0_4_ + auVar33._0_4_;
    auVar63._0_4_ = (float)(undefined4)uVar14 * fVar49 + (float)(undefined4)uVar13 * fVar48;
    auVar63._4_4_ = (float)uVar14._4_4_ * fVar49 + (float)uVar13._4_4_ * fVar48;
    auVar63._8_4_ = fVar49 * 0.0 + fVar48 * 0.0;
    auVar63._12_4_ = fVar49 * 0.0 + fVar48 * 0.0;
    auVar33 = vmovshdup_avx(auVar40);
    fVar49 = auVar33._0_4_;
    fVar48 = -(rayi->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z - fVar49;
    uVar17._0_4_ = (rayi->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y;
    uVar17._4_4_ = (rayi->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z;
    auVar38._0_8_ = uVar17 ^ 0x8000000080000000;
    auVar38._8_4_ = 0x80000000;
    auVar38._12_4_ = 0x80000000;
    fVar56 = -(rayi->ryDirection).super_Tuple3<pbrt::Vector3,_float>.x - fVar54;
    auVar34 = vsubps_avx(auVar38,auVar40);
    auVar60 = ZEXT416((uint)fVar67);
    auVar38 = ZEXT416((uint)fVar45);
    auVar42 = ZEXT416((uint)fVar56);
    if (flags == 0x12) {
      __return_storage_ptr__->hasDifferentials = true;
      pPVar30 = &(this->super_Interaction).pi;
      pPVar31 = &(this->super_Interaction).pi;
      auVar37._0_4_ =
           (pPVar30->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      auVar37._4_4_ =
           (pPVar30->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high
      ;
      auVar37._8_4_ =
           (pPVar31->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      auVar37._12_4_ =
           (pPVar31->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high
      ;
      fVar68 = ((this->super_Interaction).pi.super_Point3<pbrt::Interval>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
               (this->super_Interaction).pi.super_Point3<pbrt::Interval>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
      auVar35 = vinsertps_avx(auVar37,ZEXT416((uint)(this->super_Interaction).pi.
                                                    super_Point3<pbrt::Interval>.
                                                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                                                    high),0x10);
      auVar70._8_8_ = 0;
      auVar70._0_8_ =
           *(ulong *)&(this->super_Interaction).pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar35 = vaddps_avx512vl(auVar70,auVar35);
      auVar39._8_4_ = 0x3f000000;
      auVar39._0_8_ = 0x3f0000003f000000;
      auVar39._12_4_ = 0x3f000000;
      auVar35 = vmulps_avx512vl(auVar35,auVar39);
      uVar5 = (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar22 = (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar71._4_4_ = uVar22;
      auVar71._0_4_ = uVar5;
      auVar71._8_8_ = 0;
      auVar36 = vaddps_avx512vl(auVar35,auVar71);
      auVar37 = vaddss_avx512f(ZEXT416((uint)fVar68),
                               ZEXT416((uint)(this->dpdx).super_Tuple3<pbrt::Vector3,_float>.z));
      uVar11 = vmovlps_avx512f(auVar36);
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar11;
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar11 >> 0x20);
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z = auVar37._0_4_;
      uVar6 = (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar23 = (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar72._4_4_ = uVar23;
      auVar72._0_4_ = uVar6;
      auVar72._8_8_ = 0;
      auVar35 = vaddps_avx512vl(auVar35,auVar72);
      fVar66 = (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
      uVar11 = vmovlps_avx(auVar35);
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar11;
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar11 >> 0x20);
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z = fVar68 + fVar66;
      fVar66 = 1.0 / local_24;
      auVar35 = vmovshdup_avx512vl(auVar44);
      auVar36 = vfmadd213ss_avx512f(auVar35,auVar40,ZEXT416((uint)(fVar49 * fVar67)));
      auVar35 = vfmsub231ss_fma(ZEXT416((uint)(fVar49 * fVar67)),auVar60,auVar33);
      auVar35 = vaddss_avx512f(auVar36,auVar35);
      auVar43 = ZEXT416((uint)fVar54);
      auVar35 = vfmadd231ss_fma(auVar35,auVar44,auVar43);
      vxorps_avx512vl(auVar36,auVar36);
      vucomiss_avx512f(auVar35);
      auVar36 = vmovshdup_avx(auVar63);
      auVar35 = vinsertps_avx(ZEXT416((uint)fVar55),auVar63,0x1c);
      auVar37 = vmovshdup_avx512vl(auVar32);
      auVar63 = vmovshdup_avx(auVar44);
      auVar39 = vfmadd213ss_avx512f(auVar37,auVar63,ZEXT416((uint)(fVar48 * fVar67)));
      auVar37 = vfmsub231ss_fma(ZEXT416((uint)(fVar48 * fVar67)),auVar60,ZEXT416((uint)fVar48));
      auVar37 = vaddss_avx512f(auVar39,auVar37);
      auVar37 = vfmadd231ss_fma(auVar37,auVar44,auVar32);
      auVar39 = vmulss_avx512f(auVar33,auVar38);
      auVar41 = vmovshdup_avx512vl(auVar57);
      auVar41 = vfmadd213ss_avx512f(auVar41,auVar40,auVar39);
      auVar38 = vfmsub231ss_avx512f(auVar39,auVar38,auVar33);
      auVar38 = vaddss_avx512f(auVar41,auVar38);
      auVar38 = vfmadd231ss_avx512f(auVar38,auVar57,auVar43);
      auVar37 = vaddss_avx512f(auVar38,auVar37);
      auVar38 = vmovshdup_avx(auVar34);
      auVar39 = vmulss_avx512f(auVar38,auVar60);
      auVar41 = vfmadd213ss_avx512f(auVar34,auVar63,auVar39);
      auVar38 = vfmsub213ss_avx512f(auVar38,auVar60,auVar39);
      auVar38 = vaddss_avx512f(auVar41,auVar38);
      auVar42 = vfmadd231ss_avx512f(auVar38,auVar44,auVar42);
      auVar38 = vmovshdup_avx(auVar35);
      auVar39 = vmulss_avx512f(auVar33,auVar36);
      auVar41 = vfmadd213ss_avx512f(auVar40,auVar38,auVar39);
      auVar39 = vfmsub231ss_avx512f(auVar39,auVar36,auVar33);
      auVar39 = vaddss_avx512f(auVar41,auVar39);
      auVar39 = vfmadd231ss_avx512f(auVar39,auVar35,auVar43);
      auVar42 = vaddss_avx512f(auVar39,auVar42);
      auVar39 = vmulss_avx512f(auVar33,auVar60);
      auVar40 = vfmadd213ss_avx512f(auVar40,auVar63,auVar39);
      auVar33 = vfmsub231ss_avx512f(auVar39,auVar60,auVar33);
      auVar33 = vaddss_avx512f(auVar40,auVar33);
      auVar33 = vfmadd231ss_fma(auVar33,auVar44,auVar43);
      auVar40 = vmulss_avx512f(ZEXT416((uint)(fVar66 * fVar66)),auVar33);
      auVar43._0_4_ = fVar66 * auVar34._0_4_;
      auVar43._4_4_ = fVar66 * auVar34._4_4_;
      auVar43._8_4_ = fVar66 * auVar34._8_4_;
      auVar43._12_4_ = fVar66 * auVar34._12_4_;
      auVar73._4_4_ = local_30.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar73._0_4_ = local_30.super_Tuple3<pbrt::Vector3,_float>.x;
      auVar74._8_8_ = 0;
      auVar74._0_8_ =
           CONCAT44(local_30.super_Tuple3<pbrt::Vector3,_float>.z,
                    local_30.super_Tuple3<pbrt::Vector3,_float>.y);
      auVar34 = vmovshdup_avx512vl(auVar74);
      auVar39 = vmulss_avx512f(auVar60,auVar34);
      auVar43 = vsubps_avx512vl(auVar74,auVar43);
      auVar75._8_8_ = 0;
      auVar75._0_8_ =
           CONCAT44(local_30.super_Tuple3<pbrt::Vector3,_float>.z,
                    local_30.super_Tuple3<pbrt::Vector3,_float>.y);
      auVar41 = vfmadd213ss_avx512f(auVar75,auVar63,auVar39);
      auVar39 = vfmsub231ss_avx512f(auVar39,auVar60,auVar34);
      auVar39 = vaddss_avx512f(auVar41,auVar39);
      auVar44 = vfmadd231ss_avx512f(auVar39,auVar44,
                                    ZEXT416((uint)local_30.super_Tuple3<pbrt::Vector3,_float>.x));
      auVar41._8_4_ = 0x7fffffff;
      auVar41._0_8_ = 0x7fffffff7fffffff;
      auVar41._12_4_ = 0x7fffffff;
      auVar44 = vandps_avx512vl(auVar44,auVar41);
      auVar33 = vfmsub213ss_fma(auVar33,ZEXT416((uint)fVar66),auVar44);
      auVar44 = vdivss_avx512f(auVar40,auVar44);
      auVar40 = ZEXT416((uint)(fVar66 - auVar44._0_4_));
      auVar44 = vmulss_avx512f(auVar37,auVar40);
      auVar40 = vmulss_avx512f(auVar42,auVar40);
      auVar34 = vsubss_avx512f(auVar34,ZEXT416((uint)(fVar66 * fVar48)));
      fVar48 = auVar33._0_4_;
      auVar33 = vmulss_avx512f(auVar60,auVar44);
      auVar33 = vaddss_avx512f(ZEXT416((uint)(fVar45 * fVar48)),auVar33);
      auVar59._0_4_ = fVar66 * auVar32._0_4_;
      auVar59._4_4_ = fVar66 * auVar32._4_4_;
      auVar59._8_4_ = fVar66 * auVar32._8_4_;
      auVar59._12_4_ = fVar66 * auVar32._12_4_;
      auVar73._8_8_ = 0;
      auVar32 = vsubps_avx512vl(auVar73,auVar59);
      fVar67 = auVar44._0_4_;
      auVar58._0_4_ = auVar32._0_4_ + fVar67 * (float)(undefined4)uVar12 + fVar48 * auVar57._0_4_;
      auVar58._4_4_ = auVar32._4_4_ + fVar67 * (float)uVar12._4_4_ + fVar48 * auVar57._4_4_;
      auVar58._8_4_ = auVar32._8_4_ + fVar67 * 0.0 + fVar48 * auVar57._8_4_;
      auVar58._12_4_ = auVar32._12_4_ + fVar67 * 0.0 + fVar48 * auVar57._12_4_;
      uVar11 = vmovlps_avx(auVar58);
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x =
           (float)(int)uVar11;
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar11 >> 0x20);
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z =
           auVar34._0_4_ + auVar33._0_4_;
      auVar33 = vinsertps_avx(auVar38,auVar36,0x10);
      fVar45 = auVar40._0_4_;
      fVar67 = (local_30.super_Tuple3<pbrt::Vector3,_float>.x - fVar66 * fVar56) +
               auVar35._0_4_ * fVar48 + fVar45 * (float)(undefined4)uVar12;
      auVar32 = vinsertps_avx(auVar63,auVar60,0x10);
      auVar46._0_4_ = auVar43._0_4_ + fVar48 * auVar33._0_4_ + auVar32._0_4_ * fVar45;
      auVar46._4_4_ = auVar43._4_4_ + fVar48 * auVar33._4_4_ + auVar32._4_4_ * fVar45;
      auVar46._8_4_ = auVar43._8_4_ + fVar48 * auVar33._8_4_ + auVar32._8_4_ * fVar45;
      auVar46._12_4_ = auVar43._12_4_ + fVar48 * auVar33._12_4_ + auVar32._12_4_ * fVar45;
    }
    else {
      if (flags != 0x11) goto LAB_002ca478;
      __return_storage_ptr__->hasDifferentials = true;
      pPVar30 = &(this->super_Interaction).pi;
      pPVar31 = &(this->super_Interaction).pi;
      auVar28._0_4_ =
           (pPVar30->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      auVar28._4_4_ =
           (pPVar30->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high
      ;
      auVar28._8_4_ =
           (pPVar31->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      auVar28._12_4_ =
           (pPVar31->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high
      ;
      fVar66 = ((this->super_Interaction).pi.super_Point3<pbrt::Interval>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
               (this->super_Interaction).pi.super_Point3<pbrt::Interval>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
      uVar11 = *(undefined8 *)
                &(this->super_Interaction).pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar35 = vinsertps_avx(auVar28,ZEXT416((uint)(this->super_Interaction).pi.
                                                    super_Point3<pbrt::Interval>.
                                                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                                                    high),0x10);
      auVar64._0_4_ = (float)uVar11 + auVar35._0_4_;
      auVar64._4_4_ = (float)((ulong)uVar11 >> 0x20) + auVar35._4_4_;
      auVar64._8_4_ = auVar35._8_4_ + 0.0;
      auVar64._12_4_ = auVar35._12_4_ + 0.0;
      auVar29._8_4_ = 0x3f000000;
      auVar29._0_8_ = 0x3f0000003f000000;
      auVar29._12_4_ = 0x3f000000;
      auVar35 = vmulps_avx512vl(auVar64,auVar29);
      uVar3 = (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar20 = (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar69._0_4_ = auVar35._0_4_ + (float)uVar3;
      auVar69._4_4_ = auVar35._4_4_ + (float)uVar20;
      auVar69._8_4_ = auVar35._8_4_ + 0.0;
      auVar69._12_4_ = auVar35._12_4_ + 0.0;
      auVar36 = vaddss_avx512f(ZEXT416((uint)fVar66),
                               ZEXT416((uint)(this->dpdx).super_Tuple3<pbrt::Vector3,_float>.z));
      uVar11 = vmovlps_avx(auVar69);
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar11;
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar11 >> 0x20);
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z = auVar36._0_4_;
      uVar4 = (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar21 = (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar65._0_4_ = auVar35._0_4_ + (float)uVar4;
      auVar65._4_4_ = auVar35._4_4_ + (float)uVar21;
      auVar65._8_4_ = auVar35._8_4_ + 0.0;
      auVar65._12_4_ = auVar35._12_4_ + 0.0;
      fVar56 = (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
      uVar11 = vmovlps_avx(auVar65);
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar11;
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar11 >> 0x20);
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z = fVar66 + fVar56;
      auVar35 = vmovshdup_avx(auVar44);
      auVar36 = vmovshdup_avx(auVar32);
      auVar36 = vfmadd213ss_fma(auVar36,auVar35,ZEXT416((uint)(fVar48 * fVar67)));
      auVar37 = vfmsub231ss_fma(ZEXT416((uint)(fVar48 * fVar67)),auVar60,ZEXT416((uint)fVar48));
      auVar36 = vfmadd231ss_fma(ZEXT416((uint)(auVar36._0_4_ + auVar37._0_4_)),auVar44,auVar32);
      auVar37 = vmovshdup_avx512vl(auVar57);
      auVar37 = vfmadd213ss_avx512f(auVar37,auVar40,ZEXT416((uint)(fVar49 * fVar45)));
      auVar38 = vfmsub231ss_fma(ZEXT416((uint)(fVar49 * fVar45)),auVar38,auVar33);
      auVar38 = vaddss_avx512f(auVar37,auVar38);
      auVar41 = ZEXT416((uint)fVar54);
      auVar38 = vfmadd231ss_fma(auVar38,auVar57,auVar41);
      fVar56 = auVar38._0_4_ + auVar36._0_4_;
      auVar38 = vmovshdup_avx(auVar34);
      auVar36 = vmulss_avx512f(auVar60,auVar38);
      auVar37 = vfmadd213ss_avx512f(auVar34,auVar35,auVar36);
      auVar38 = vfmsub213ss_avx512f(auVar38,auVar60,auVar36);
      auVar38 = vaddss_avx512f(auVar37,auVar38);
      auVar38 = vfmadd231ss_fma(auVar38,auVar44,auVar42);
      auVar36 = vmovshdup_avx512vl(auVar63);
      auVar37 = vmulss_avx512f(auVar36,auVar33);
      auVar39 = vfmadd213ss_avx512f(auVar40,auVar63,auVar37);
      auVar36 = vfmsub213ss_avx512f(auVar36,auVar33,auVar37);
      auVar36 = vaddss_avx512f(auVar39,auVar36);
      auVar36 = vfmadd231ss_avx512f(auVar36,ZEXT416((uint)fVar55),auVar41);
      auVar38 = vaddss_avx512f(auVar36,auVar38);
      auVar36 = vmulss_avx512f(auVar60,auVar33);
      auVar40 = vfmadd213ss_avx512f(auVar40,auVar35,auVar36);
      auVar33 = vfmsub231ss_avx512f(auVar36,auVar60,auVar33);
      auVar33 = vaddss_avx512f(auVar40,auVar33);
      auVar33 = vfmadd231ss_fma(auVar33,auVar44,auVar41);
      fVar66 = auVar33._0_4_;
      fVar45 = fVar45 * fVar66 + fVar56 * fVar67;
      auVar33 = vsubss_avx512f(ZEXT416((uint)local_30.super_Tuple3<pbrt::Vector3,_float>.x),auVar42)
      ;
      fVar68 = auVar38._0_4_;
      fVar67 = fVar55 * fVar66 + fVar68 * (float)(undefined4)uVar12;
      fVar67 = fVar67 + fVar67 + auVar33._0_4_;
      auVar61._4_4_ = local_30.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar61._0_4_ = local_30.super_Tuple3<pbrt::Vector3,_float>.x;
      auVar61._8_8_ = 0;
      auVar62._4_4_ = local_30.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar62._0_4_ = local_30.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar62._8_8_ = 0;
      auVar33 = vmovshdup_avx(auVar62);
      fVar49 = auVar57._0_4_ * fVar66 + fVar56 * (float)(undefined4)uVar12;
      fVar54 = auVar57._4_4_ * fVar66 + fVar56 * (float)uVar12._4_4_;
      fVar55 = auVar57._8_4_ * fVar66 + fVar56 * 0.0;
      fVar56 = auVar57._12_4_ * fVar66 + fVar56 * 0.0;
      auVar32 = vsubps_avx(auVar61,auVar32);
      auVar50._0_4_ = fVar49 + fVar49 + auVar32._0_4_;
      auVar50._4_4_ = fVar54 + fVar54 + auVar32._4_4_;
      auVar50._8_4_ = fVar55 + fVar55 + auVar32._8_4_;
      auVar50._12_4_ = fVar56 + fVar56 + auVar32._12_4_;
      uVar11 = vmovlps_avx(auVar50);
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x =
           (float)(int)uVar11;
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar11 >> 0x20);
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z =
           (auVar33._0_4_ - fVar48) + fVar45 + fVar45;
      auVar32 = vsubps_avx(auVar62,auVar34);
      auVar33 = vinsertps_avx(auVar35,auVar60,0x10);
      fVar45 = auVar63._0_4_ * fVar66 + auVar33._0_4_ * fVar68;
      fVar48 = auVar63._4_4_ * fVar66 + auVar33._4_4_ * fVar68;
      fVar56 = auVar63._8_4_ * fVar66 + auVar33._8_4_ * fVar68;
      fVar49 = auVar63._12_4_ * fVar66 + auVar33._12_4_ * fVar68;
      auVar46._0_4_ = fVar45 + fVar45 + auVar32._0_4_;
      auVar46._4_4_ = fVar48 + fVar48 + auVar32._4_4_;
      auVar46._8_4_ = fVar56 + fVar56 + auVar32._8_4_;
      auVar46._12_4_ = fVar49 + fVar49 + auVar32._12_4_;
    }
    auVar33 = vunpcklps_avx(ZEXT416((uint)fVar67),auVar46);
    uVar11 = vmovlps_avx(auVar33);
    (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar11;
    (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y =
         (float)(int)((ulong)uVar11 >> 0x20);
    fVar67 = (float)vextractps_avx(auVar46,1);
    (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z = fVar67;
  }
LAB_002ca478:
  fVar67 = (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar7 = (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y;
  uVar24 = (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar32._0_4_ = (float)uVar7 * (float)uVar7;
  auVar32._4_4_ = (float)uVar24 * (float)uVar24;
  auVar32._8_8_ = 0;
  auVar33 = vmovshdup_avx(auVar32);
  if ((((1e+16 < fVar67 * fVar67 + auVar32._0_4_ + auVar33._0_4_) ||
       (fVar67 = (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.x,
       uVar8 = (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y,
       uVar25 = (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z,
       auVar51._0_4_ = (float)uVar8 * (float)uVar8, auVar51._4_4_ = (float)uVar25 * (float)uVar25,
       auVar51._8_8_ = 0, auVar33 = vmovshdup_avx(auVar51),
       1e+16 < fVar67 * fVar67 + auVar51._0_4_ + auVar33._0_4_)) ||
      (fVar67 = (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x,
      uVar9 = (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y,
      uVar26 = (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z,
      auVar52._0_4_ = (float)uVar9 * (float)uVar9, auVar52._4_4_ = (float)uVar26 * (float)uVar26,
      auVar52._8_8_ = 0, auVar33 = vmovshdup_avx(auVar52),
      1e+16 < fVar67 * fVar67 + auVar52._0_4_ + auVar33._0_4_)) ||
     (fVar67 = (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x,
     uVar10 = (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y,
     uVar27 = (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z,
     auVar53._0_4_ = (float)uVar10 * (float)uVar10, auVar53._4_4_ = (float)uVar27 * (float)uVar27,
     auVar53._8_8_ = 0, auVar33 = vmovshdup_avx(auVar53),
     1e+16 < fVar67 * fVar67 + auVar53._0_4_ + auVar33._0_4_)) {
    __return_storage_ptr__->hasDifferentials = false;
  }
  return __return_storage_ptr__;
}

Assistant:

RayDifferential SurfaceInteraction::SpawnRay(const RayDifferential &rayi,
                                             const BSDF &bsdf, Vector3f wi, int flags,
                                             Float eta) const {
    RayDifferential rd(SpawnRay(wi));
    if (rayi.hasDifferentials) {
        // Compute ray differentials for specular reflection or transmission
        // Compute common factors for specular ray differentials
        Normal3f ns = shading.n;
        Normal3f dndx = shading.dndu * dudx + shading.dndv * dvdx;
        Normal3f dndy = shading.dndu * dudy + shading.dndv * dvdy;
        Vector3f dwodx = -rayi.rxDirection - wo, dwody = -rayi.ryDirection - wo;

        if (flags == BxDFFlags::SpecularReflection) {
            // Initialize origins of specular differential rays
            rd.hasDifferentials = true;
            rd.rxOrigin = p() + dpdx;
            rd.ryOrigin = p() + dpdy;

            // Compute differential reflected directions
            Float dwoDotNdx = Dot(dwodx, ns) + Dot(wo, dndx);
            Float dwoDotNdy = Dot(dwody, ns) + Dot(wo, dndy);
            rd.rxDirection =
                wi - dwodx + 2 * Vector3f(Dot(wo, ns) * dndx + dwoDotNdx * ns);
            rd.ryDirection =
                wi - dwody + 2 * Vector3f(Dot(wo, ns) * dndy + dwoDotNdy * ns);

        } else if (flags == BxDFFlags::SpecularTransmission) {
            // Initialize origins of specular differential rays
            rd.hasDifferentials = true;
            rd.rxOrigin = p() + dpdx;
            rd.ryOrigin = p() + dpdy;

            // Compute differential transmitted directions
            // Find _eta_ and oriented surface normal for transmission
            eta = 1 / eta;
            if (Dot(wo, ns) < 0) {
                ns = -ns;
                dndx = -dndx;
                dndy = -dndy;
            }

            // Compute partial derivatives of $\mu$
            Float dwoDotNdx = Dot(dwodx, ns) + Dot(wo, dndx);
            Float dwoDotNdy = Dot(dwody, ns) + Dot(wo, dndy);
            Float mu = eta * Dot(wo, ns) - AbsDot(wi, ns);
            Float dmudx = (eta - (eta * eta * Dot(wo, ns)) / AbsDot(wi, ns)) * dwoDotNdx;
            Float dmudy = (eta - (eta * eta * Dot(wo, ns)) / AbsDot(wi, ns)) * dwoDotNdy;

            rd.rxDirection = wi - eta * dwodx + Vector3f(mu * dndx + dmudx * ns);
            rd.ryDirection = wi - eta * dwody + Vector3f(mu * dndy + dmudy * ns);
        }
    }
    // Squash potentially troublesome differentials
    if (LengthSquared(rd.rxDirection) > 1e16f || LengthSquared(rd.ryDirection) > 1e16f ||
        LengthSquared(Vector3f(rd.rxOrigin)) > 1e16f ||
        LengthSquared(Vector3f(rd.ryOrigin)) > 1e16f)
        rd.hasDifferentials = false;

    return rd;
}